

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

void Ifn_ManSatDeriveOne(sat_solver *pSat,Vec_Int_t *vPiVars,Vec_Int_t *vValues)

{
  int iVar1;
  int i;
  
  vValues->nSize = 0;
  for (i = 0; i < vPiVars->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vPiVars,i);
    iVar1 = sat_solver_var_value(pSat,iVar1);
    Vec_IntPush(vValues,iVar1);
  }
  return;
}

Assistant:

void Ifn_ManSatDeriveOne( sat_solver * pSat, Vec_Int_t * vPiVars, Vec_Int_t * vValues )
{
    int i, iVar;
    Vec_IntClear( vValues );
    Vec_IntForEachEntry( vPiVars, iVar, i )
        Vec_IntPush( vValues, sat_solver_var_value(pSat, iVar) );
}